

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpSubgraphStart
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub,char *name)

{
  ofstream *poVar1;
  ostream *poVar2;
  
  poVar1 = &this->out;
  poVar2 = std::operator<<((ostream *)poVar1,"\t/* subgraph ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::operator<<(poVar2," nodes */\n");
  poVar2 = std::operator<<((ostream *)poVar1,"\tsubgraph cluster_");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::operator<<(poVar2," {\n");
  std::operator<<((ostream *)poVar1,"\t\tstyle=\"filled, rounded\" fillcolor=gray95\n");
  std::operator<<((ostream *)poVar1,"\t\tlabel=\"Subgraph ");
  if (name != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)poVar1,name);
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)poVar1,"[");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,"]");
  poVar2 = std::operator<<(poVar2,"\\nhas ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," nodes\n");
  if ((sub->super_DependenceGraphBase).slice_id != 0) {
    poVar2 = std::operator<<((ostream *)poVar1,"\\nslice: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::operator<<((ostream *)poVar1,"\"\n");
  dump_parameters(this,sub,2);
  return;
}

Assistant:

void dumpSubgraphStart(DependenceGraph<NodeT> *sub,
                           const char *name = nullptr) {
        out << "\t/* subgraph " << sub << " nodes */\n";
        out << "\tsubgraph cluster_" << sub << " {\n";
        out << "\t\tstyle=\"filled, rounded\" fillcolor=gray95\n";
        out << "\t\tlabel=\"Subgraph ";
        if (name)
            out << name << " ";

        out << "[" << sub << "]"
            << "\\nhas " << sub->size() << " nodes\n";

        uint64_t slice_id = sub->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        // dump BBs of the formal parameters
        dump_parameters(sub, 2);
    }